

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  int iVar1;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if ((zSql != (char *)0x0) && (iVar1 != 0)) {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    sqlite3BtreeEnterAll(db);
    iVar1 = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
    if (iVar1 == 0x11) {
      sqlite3_finalize(*ppStmt);
      iVar1 = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
    }
    sqlite3BtreeLeaveAll(db);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar1;
  }
  iVar1 = sqlite3MisuseError(0x1c9de);
  return iVar1;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
  if( rc==SQLITE_SCHEMA ){
    sqlite3_finalize(*ppStmt);
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  assert( rc==SQLITE_OK || *ppStmt==0 );
  return rc;
}